

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.cpp
# Opt level: O2

void __thiscall tcu::LogWriteFailedError::LogWriteFailedError(LogWriteFailedError *this)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"Writing to test log failed",&local_31);
  ResourceError::ResourceError(&this->super_ResourceError,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  *(undefined ***)&(this->super_ResourceError).super_TestException.super_Exception =
       &PTR__Exception_01e74af8;
  return;
}

Assistant:

LogWriteFailedError (void) : ResourceError("Writing to test log failed") {}